

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef __thiscall llvm::ARM::getArchExtFeature(ARM *this,StringRef ArchExt)

{
  char *pcVar1;
  unsigned_long *puVar2;
  ARM *pAVar3;
  bool bVar4;
  StringRef SVar5;
  bool local_299;
  char *local_288;
  char *local_280;
  undefined1 local_268 [8];
  anon_struct_40_5_444f9c93 AE_1;
  anon_struct_40_5_444f9c93 *__end1;
  anon_struct_40_5_444f9c93 *__begin1;
  anon_struct_40_5_444f9c93 (*__range1) [21];
  char *local_220;
  undefined1 local_208 [8];
  anon_struct_40_5_444f9c93 AE;
  anon_struct_40_5_444f9c93 *__end2;
  anon_struct_40_5_444f9c93 *__begin2;
  anon_struct_40_5_444f9c93 (*__range2) [21];
  StringRef ArchExtBase;
  ARM *local_1a8;
  StringRef ArchExt_local;
  ARM *local_168;
  char *local_160;
  anon_struct_40_5_444f9c93 (*local_158) [21];
  char *local_150;
  anon_struct_40_5_444f9c93 (*local_148) [21];
  char *local_140;
  ARM *local_138;
  char *local_130;
  char *local_128;
  size_t *local_120;
  char *local_118;
  size_t *local_110;
  uint local_108;
  undefined4 uStack_104;
  size_t *local_100;
  ARM **local_f8;
  size_t local_f0;
  char *local_e8;
  unsigned_long local_e0 [3];
  ARM **local_c8;
  undefined1 local_c0 [16];
  char *local_b0;
  ARM *local_a8;
  undefined1 *local_a0;
  ARM **local_98;
  anon_struct_40_5_444f9c93 (*local_90) [21];
  char *local_88;
  ARM **local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  ARM *local_58;
  int local_4c;
  char *local_48;
  anon_struct_40_5_444f9c93 (*local_40) [21];
  ARM *local_38;
  int local_2c;
  char *local_28;
  size_t local_20;
  ARM *local_18;
  int local_c;
  
  ArchExt_local.Data = ArchExt.Data;
  local_120 = &ArchExtBase.Length;
  local_128 = "no";
  ArchExtBase.Length = (size_t)anon_var_dwarf_31bd9f;
  local_1a8 = this;
  local_e8 = (char *)strlen("no");
  local_f0 = ArchExtBase.Length;
  local_f8 = &local_1a8;
  local_299 = false;
  if (local_e8 <= ArchExt_local.Data) {
    local_18 = local_1a8;
    local_20 = ArchExtBase.Length;
    local_28 = local_e8;
    if (local_e8 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_1a8,(void *)ArchExtBase.Length,(size_t)local_e8);
    }
    local_299 = local_c == 0;
  }
  if (local_299) {
    local_c8 = &local_1a8;
    local_e0[2] = 2;
    local_e0[1] = 0xffffffffffffffff;
    puVar2 = std::min<unsigned_long>(local_e0 + 2,(unsigned_long *)&ArchExt_local);
    local_e0[2] = *puVar2;
    pAVar3 = local_1a8 + local_e0[2];
    local_e0[0] = (long)ArchExt_local.Data - local_e0[2];
    puVar2 = std::min<unsigned_long>(local_e0 + 1,local_e0);
    ArchExtBase.Data = (char *)*puVar2;
    local_a0 = local_c0;
    AE.NegFeature = "";
    local_b0 = ArchExtBase.Data;
    local_a8 = pAVar3;
    for (__end2 = (anon_struct_40_5_444f9c93 *)(anonymous_namespace)::ARCHExtNames;
        __end2 != (anon_struct_40_5_444f9c93 *)AE.NegFeature; __end2 = __end2 + 1) {
      memcpy(local_208,__end2,0x28);
      pcVar1 = ArchExtBase.Data;
      bVar4 = false;
      if (AE.Feature != (char *)0x0) {
        SVar5 = anon_unknown.dwarf_31c05e::anon_struct_40_5_444f9c93::getName
                          ((anon_struct_40_5_444f9c93 *)local_208);
        __range1 = (anon_struct_40_5_444f9c93 (*) [21])SVar5.Data;
        local_220 = (char *)SVar5.Length;
        local_130 = pcVar1;
        local_148 = __range1;
        local_140 = local_220;
        local_158 = __range1;
        local_150 = local_220;
        local_90 = __range1;
        local_88 = local_220;
        local_98 = &local_138;
        bVar4 = false;
        local_138 = pAVar3;
        if (pcVar1 == local_220) {
          local_40 = __range1;
          local_48 = local_220;
          local_38 = pAVar3;
          if (local_220 == (char *)0x0) {
            local_2c = 0;
          }
          else {
            local_2c = memcmp(pAVar3,__range1,(size_t)local_220);
          }
          bVar4 = local_2c == 0;
        }
      }
      if (bVar4) {
        local_110 = &ArchExt_local.Length;
        local_118 = AE.Feature;
        ArchExt_local.Length = (size_t)AE.Feature;
        if (AE.Feature == (char *)0x0) {
          return unique0x10000322;
        }
        strlen(AE.Feature);
        return stack0xfffffffffffffe68;
      }
    }
  }
  __end1 = (anon_struct_40_5_444f9c93 *)(anonymous_namespace)::ARCHExtNames;
  AE_1.NegFeature = "";
  while( true ) {
    if (__end1 == (anon_struct_40_5_444f9c93 *)AE_1.NegFeature) {
      memset(&ArchExt_local.Length,0,0x10);
      StringRef::StringRef((StringRef *)&ArchExt_local.Length);
      return stack0xfffffffffffffe68;
    }
    memcpy(local_268,__end1,0x28);
    pcVar1 = ArchExt_local.Data;
    pAVar3 = local_1a8;
    bVar4 = false;
    if (AE_1._16_8_ != 0) {
      SVar5 = anon_unknown.dwarf_31c05e::anon_struct_40_5_444f9c93::getName
                        ((anon_struct_40_5_444f9c93 *)local_268);
      local_288 = SVar5.Data;
      local_280 = (char *)SVar5.Length;
      local_168 = pAVar3;
      local_160 = pcVar1;
      local_78 = local_288;
      local_70 = local_280;
      local_80 = &local_168;
      bVar4 = false;
      if (pcVar1 == local_280) {
        local_58 = pAVar3;
        local_60 = local_288;
        local_68 = local_280;
        if (local_280 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(pAVar3,local_288,(size_t)local_280);
        }
        bVar4 = local_4c == 0;
      }
    }
    if (bVar4) break;
    __end1 = __end1 + 1;
  }
  local_100 = &ArchExt_local.Length;
  local_108 = AE_1.ID;
  uStack_104 = AE_1._20_4_;
  ArchExt_local.Length = AE_1._16_8_;
  if (AE_1._16_8_ == 0) {
    return unique0x10000332;
  }
  strlen((char *)AE_1._16_8_);
  return stack0xfffffffffffffe68;
}

Assistant:

StringRef llvm::ARM::getArchExtFeature(StringRef ArchExt) {
  if (ArchExt.startswith("no")) {
    StringRef ArchExtBase(ArchExt.substr(2));
    for (const auto AE : ARCHExtNames) {
      if (AE.NegFeature && ArchExtBase == AE.getName())
        return StringRef(AE.NegFeature);
    }
  }
  for (const auto AE : ARCHExtNames) {
    if (AE.Feature && ArchExt == AE.getName())
      return StringRef(AE.Feature);
  }

  return StringRef();
}